

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_bench.cc
# Opt level: O1

void __thiscall leveldb::Benchmark::DoDelete(Benchmark *this,ThreadState *thread,bool seq)

{
  int iVar1;
  uint uVar2;
  undefined8 uVar3;
  ulong uVar4;
  uint uVar5;
  int iVar6;
  double *pdVar7;
  undefined1 auVar8 [16];
  double dVar9;
  Status s;
  WriteBatch batch;
  RandomGenerator gen;
  char key [100];
  undefined1 local_108 [24];
  Slice local_f0;
  WriteBatch local_e0;
  RandomGenerator local_c0;
  Cache *local_98 [13];
  
  pdVar7 = (double *)local_108;
  anon_unknown_0::RandomGenerator::RandomGenerator(&local_c0);
  WriteBatch::WriteBatch(&local_e0);
  local_108._0_8_ = (Cache *)0x0;
  if (0 < this->num_) {
    local_108._16_8_ = &this->write_options_;
    local_108._8_8_ = (FilterPolicy *)0x0;
    do {
      WriteBatch::Clear(&local_e0);
      if (0 < this->entries_per_batch_) {
        iVar6 = 0;
        do {
          if (seq) {
            uVar4 = (ulong)(uint)((int)local_108._8_8_ + iVar6);
          }
          else {
            uVar4 = (ulong)(thread->rand).seed_ * 0x41a7;
            uVar2 = (uint)uVar4 & 0x7fffffff;
            iVar1 = (int)(uVar4 >> 0x1f);
            uVar5 = iVar1 + uVar2;
            uVar2 = iVar1 + uVar2 + 0x80000001;
            if (-1 < (int)uVar5) {
              uVar2 = uVar5;
            }
            (thread->rand).seed_ = uVar2;
            uVar4 = (ulong)uVar2 % (ulong)(uint)FLAGS_num;
          }
          snprintf((char *)local_98,100,"%016d",uVar4);
          local_f0.data_ = (char *)local_98;
          local_f0.size_ = strlen((char *)local_98);
          WriteBatch::Delete(&local_e0,&local_f0);
          anon_unknown_0::Stats::FinishedSingleOp(&thread->stats);
          iVar6 = iVar6 + 1;
        } while (iVar6 < this->entries_per_batch_);
      }
      (*this->db_->_vptr_DB[4])(local_98,this->db_,local_108._16_8_,&local_e0);
      uVar3 = local_108._0_8_;
      local_108._0_8_ = local_98[0];
      local_98[0] = (Cache *)uVar3;
      if ((Cache *)uVar3 != (Cache *)0x0) {
        operator_delete__((void *)uVar3);
      }
      if ((Cache *)local_108._0_8_ != (Cache *)0x0) {
        DoDelete((Benchmark *)local_108);
        *(undefined4 *)((long)pdVar7 + 0x1c) = 100;
        Histogram::Clear((Histogram *)(pdVar7 + 6));
        *(undefined4 *)(pdVar7 + 3) = 0;
        pdVar7[4] = 0.0;
        pdVar7[2] = 0.0;
        pdVar7[0xa6] = 0.0;
        *(undefined1 *)pdVar7[0xa5] = 0;
        uVar3 = (**(code **)(*(anonymous_namespace)::g_env + 0xa8))();
        auVar8._8_4_ = (int)((ulong)uVar3 >> 0x20);
        auVar8._0_8_ = uVar3;
        auVar8._12_4_ = 0x45300000;
        dVar9 = (auVar8._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)uVar3) - 4503599627370496.0);
        pdVar7[5] = dVar9;
        pdVar7[1] = dVar9;
        *pdVar7 = dVar9;
        return;
      }
      uVar2 = (int)local_108._8_8_ + this->entries_per_batch_;
      local_108._8_8_ = ZEXT48(uVar2);
    } while ((int)uVar2 < this->num_);
  }
  if ((Cache *)local_108._0_8_ != (Cache *)0x0) {
    operator_delete__((void *)local_108._0_8_);
  }
  WriteBatch::~WriteBatch(&local_e0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0.data_._M_dataplus._M_p != &local_c0.data_.field_2) {
    operator_delete(local_c0.data_._M_dataplus._M_p);
  }
  return;
}

Assistant:

void DoDelete(ThreadState* thread, bool seq) {
    RandomGenerator gen;
    WriteBatch batch;
    Status s;
    for (int i = 0; i < num_; i += entries_per_batch_) {
      batch.Clear();
      for (int j = 0; j < entries_per_batch_; j++) {
        const int k = seq ? i + j : (thread->rand.Next() % FLAGS_num);
        char key[100];
        std::snprintf(key, sizeof(key), "%016d", k);
        batch.Delete(key);
        thread->stats.FinishedSingleOp();
      }
      s = db_->Write(write_options_, &batch);
      if (!s.ok()) {
        std::fprintf(stderr, "del error: %s\n", s.ToString().c_str());
        std::exit(1);
      }
    }
  }